

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void adjustOrderByCol(ExprList *pOrderBy,ExprList *pEList)

{
  u16 uVar1;
  int iVar2;
  long lVar3;
  anon_union_4_2_6146edf4_for_u *paVar4;
  anon_union_4_2_6146edf4_for_u *paVar5;
  int iVar6;
  long lVar7;
  
  if ((pOrderBy != (ExprList *)0x0) && (iVar2 = pOrderBy->nExpr, 0 < (long)iVar2)) {
    lVar3 = 0;
    do {
      uVar1 = pOrderBy->a[lVar3].u.x.iOrderByCol;
      if (uVar1 != 0) {
        paVar5 = &pOrderBy->a[lVar3].u;
        iVar6 = pEList->nExpr;
        if ((long)iVar6 < 1) {
          lVar7 = 0;
LAB_001a052b:
          if ((int)lVar7 < iVar6) goto LAB_001a0536;
        }
        else {
          lVar7 = 0;
          paVar4 = &pEList->a[0].u;
          do {
            if ((paVar4->x).iOrderByCol == uVar1) {
              (paVar5->x).iOrderByCol = (short)lVar7 + 1;
              iVar6 = pEList->nExpr;
              goto LAB_001a052b;
            }
            lVar7 = lVar7 + 1;
            paVar4 = paVar4 + 6;
          } while (iVar6 != lVar7);
        }
        (paVar5->x).iOrderByCol = 0;
      }
LAB_001a0536:
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar2);
  }
  return;
}

Assistant:

static void adjustOrderByCol(ExprList *pOrderBy, ExprList *pEList){
  int i, j;
  if( pOrderBy==0 ) return;
  for(i=0; i<pOrderBy->nExpr; i++){
    int t = pOrderBy->a[i].u.x.iOrderByCol;
    if( t==0 ) continue;
    for(j=0; j<pEList->nExpr; j++){
      if( pEList->a[j].u.x.iOrderByCol==t ){
        pOrderBy->a[i].u.x.iOrderByCol = j+1;
        break;
      }
    }
    if( j>=pEList->nExpr ){
      pOrderBy->a[i].u.x.iOrderByCol = 0;
    }
  }
}